

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O0

int __thiscall
Js::LineOffsetCache::GetLineForCharacterOffset
          (LineOffsetCache *this,charcount_t characterOffset,charcount_t *outLineCharOffset,
          charcount_t *outByteOffset)

{
  code *pcVar1;
  anon_class_24_3_257c35f3 compare;
  bool bVar2;
  int iVar3;
  charcount_t cVar4;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *pRVar5;
  undefined4 *puVar6;
  charcount_t lastItemCharacterOffset;
  undefined4 local_30;
  charcount_t local_2c;
  int minRange;
  int closestIndex;
  charcount_t *outByteOffset_local;
  charcount_t *outLineCharOffset_local;
  LineOffsetCache *pLStack_10;
  charcount_t characterOffset_local;
  LineOffsetCache *this_local;
  
  _minRange = outByteOffset;
  outByteOffset_local = outLineCharOffset;
  outLineCharOffset_local._4_4_ = characterOffset;
  pLStack_10 = this;
  pRVar5 = Memory::
           WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>::
           operator->(&this->lineCharacterOffsetCacheList);
  iVar3 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Count(pRVar5);
  if (iVar3 < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0x3a,"(this->lineCharacterOffsetCacheList->Count() > 0)",
                                "this->lineCharacterOffsetCacheList->Count() > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  local_2c = 0xffffffff;
  local_30 = 0x7fffffff;
  pRVar5 = Memory::
           WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>::
           operator->(&this->lineCharacterOffsetCacheList);
  compare.minRange = &local_30;
  compare.characterOffset = (charcount_t *)((long)&outLineCharOffset_local + 4);
  compare.closestIndex = (int *)&local_2c;
  JsUtil::ReadOnlyList<unsigned_int,Memory::Recycler,DefaultComparer>::
  BinarySearch<Js::LineOffsetCache::GetLineForCharacterOffset(unsigned_int,unsigned_int*,unsigned_int*)::__0>
            ((ReadOnlyList<unsigned_int,Memory::Recycler,DefaultComparer> *)pRVar5,compare);
  if ((-1 < (int)local_2c) &&
     (cVar4 = GetCharacterOffsetForLine(this,local_2c,_minRange),
     outByteOffset_local != (charcount_t *)0x0)) {
    *outByteOffset_local = cVar4;
  }
  return local_2c;
}

Assistant:

int LineOffsetCache::GetLineForCharacterOffset(charcount_t characterOffset, charcount_t *outLineCharOffset, charcount_t *outByteOffset)
    {
        Assert(this->lineCharacterOffsetCacheList->Count() > 0);

        // The list is sorted, so binary search to find the line info.
        int closestIndex = -1;
        int minRange = INT_MAX;

        this->lineCharacterOffsetCacheList->BinarySearch([&](const charcount_t item, int index)
        {
            int offsetRange = characterOffset - item;
            if (offsetRange >= 0)
            {
                if (offsetRange < minRange)
                {
                    // There are potentially many lines with starting offsets greater than the one we're searching
                    // for.  As a result, we should track which index we've encountered so far that is the closest
                    // to the offset we're looking for without going under.  This will find the line that contains
                    // the offset.
                    closestIndex = index;
                    minRange = offsetRange;
                }

                // Search lower to see if we can find a closer index.
                return -1;
            }
            else
            {
                // Search higher to get into a range that is greater than the offset.
                return 1;
            }

            // Note that we purposely don't return 0 (==) here.  We want the search to end in failure (-1) because
            // we're searching for the closest element, not necessarily an exact element offset.  Exact offsets
            // are possible when the offset we're searching for is the first character of the line, but that will
            // be handled by the if statement above.
        });

        if (closestIndex >= 0)
        {
            charcount_t lastItemCharacterOffset = GetCharacterOffsetForLine(closestIndex, outByteOffset);

            if (outLineCharOffset != nullptr)
            {
                *outLineCharOffset = lastItemCharacterOffset;
            }
        }

        return closestIndex;
    }